

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

TryEmplaceResult * __thiscall
QHash<int,ProFileCache::Entry>::tryEmplace_impl<int_const&>
          (TryEmplaceResult *__return_storage_ptr__,void *this,int *key)

{
  uchar uVar1;
  Span *pSVar2;
  Data<QHashPrivate::Node<int,_ProFileCache::Entry>_> *pDVar3;
  ulong uVar4;
  Node<int,_ProFileCache::Entry> *pNVar6;
  long in_FS_OFFSET;
  Bucket BVar8;
  QHash<int,_ProFileCache::Entry> local_40;
  long local_38;
  Span *pSVar5;
  ulong uVar7;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = *this;
  if (pDVar3 == (Data<QHashPrivate::Node<int,_ProFileCache::Entry>_> *)0x0) {
    pDVar3 = QHashPrivate::Data<QHashPrivate::Node<int,_ProFileCache::Entry>_>::detached
                       ((Data<QHashPrivate::Node<int,_ProFileCache::Entry>_> *)0x0);
    *(Data<QHashPrivate::Node<int,_ProFileCache::Entry>_> **)this = pDVar3;
  }
  local_40.d = (Data *)0x0;
  uVar4 = (long)*key ^ pDVar3->seed;
  uVar4 = (uVar4 >> 0x20 ^ uVar4) * -0x2917014799a6026d;
  uVar4 = (uVar4 >> 0x20 ^ uVar4) * -0x2917014799a6026d;
  uVar4 = uVar4 >> 0x20 ^ uVar4;
  BVar8 = QHashPrivate::Data<QHashPrivate::Node<int,_ProFileCache::Entry>_>::findBucketWithHash<int>
                    (pDVar3,key,uVar4);
  uVar7 = BVar8.index;
  pSVar5 = BVar8.span;
  uVar1 = pSVar5->offsets[uVar7];
  pDVar3 = *this;
  if ((pDVar3 == (Data<QHashPrivate::Node<int,_ProFileCache::Entry>_> *)0x0) ||
     (1 < (uint)(pDVar3->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
    QHash<int,_ProFileCache::Entry>::operator=(&local_40,(QHash<int,_ProFileCache::Entry> *)this);
    if (uVar1 == 0xff) {
LAB_00294b77:
      pDVar3 = *this;
      if (pDVar3->numBuckets >> 1 <= pDVar3->size) {
        pDVar3 = QHashPrivate::Data<QHashPrivate::Node<int,_ProFileCache::Entry>_>::detached
                           (pDVar3,pDVar3->size + 1);
        *(Data<QHashPrivate::Node<int,_ProFileCache::Entry>_> **)this = pDVar3;
        BVar8 = QHashPrivate::Data<QHashPrivate::Node<int,_ProFileCache::Entry>_>::
                findBucketWithHash<int>(pDVar3,key,uVar4);
        goto LAB_00294bf4;
      }
    }
    else {
      pDVar3 = *this;
    }
    pSVar2 = pDVar3->spans;
    pDVar3 = QHashPrivate::Data<QHashPrivate::Node<int,_ProFileCache::Entry>_>::detached(pDVar3);
    *(Data<QHashPrivate::Node<int,_ProFileCache::Entry>_> **)this = pDVar3;
    BVar8.index._0_4_ = (uint)BVar8.index & 0x7f;
    BVar8.span = pDVar3->spans +
                 ((((ulong)((long)pSVar5 - (long)pSVar2) >> 4) * 0x1c71c71c71c71c80 | uVar7) >> 7);
    BVar8.index._4_4_ = 0;
    if (uVar1 != 0xff) goto LAB_00294c16;
  }
  else {
    if (uVar1 != 0xff) goto LAB_00294c16;
    if (pDVar3->numBuckets >> 1 <= pDVar3->size) {
      QHash<int,_ProFileCache::Entry>::operator=(&local_40,(QHash<int,_ProFileCache::Entry> *)this);
      goto LAB_00294b77;
    }
  }
LAB_00294bf4:
  pNVar6 = QHashPrivate::Span<QHashPrivate::Node<int,_ProFileCache::Entry>_>::insert
                     (BVar8.span,BVar8.index);
  pNVar6->key = *key;
  (pNVar6->value).pro = (ProFile *)0x0;
  pDVar3 = *this;
  pDVar3->size = pDVar3->size + 1;
LAB_00294c16:
  pSVar5 = pDVar3->spans;
  (__return_storage_ptr__->iterator).i.d = pDVar3;
  (__return_storage_ptr__->iterator).i.bucket =
       ((ulong)((long)BVar8.span - (long)pSVar5) >> 4) * 0x1c71c71c71c71c80 | BVar8.index;
  __return_storage_ptr__->inserted = uVar1 == 0xff;
  QHash<int,_ProFileCache::Entry>::~QHash(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

TryEmplaceResult tryEmplace_impl(K &&key, Args &&...args)
    {
        if (!d)
            detach();
        QHash detachGuard;

        size_t hash = QHashPrivate::calculateHash(key, d->seed);
        typename Data::Bucket bucket = d->findBucketWithHash(key, hash);
        const bool shouldInsert = bucket.isUnused();

        // Even if we don't insert we may have to detach because we are
        // returning a non-const iterator:
        if (!isDetached() || (shouldInsert && d->shouldGrow())) {
            detachGuard = *this;
            const bool resized = shouldInsert && d->shouldGrow();
            const size_t bucketIndex = bucket.toBucketIndex(d);

            // Must detach from detachGuard
            d = resized ? Data::detached(d, d->size + 1) : Data::detached(d);
            bucket = resized ? d->findBucketWithHash(key, hash) : typename Data::Bucket(d, bucketIndex);
        }
        if (shouldInsert) {
            Node *n = bucket.insert();
            using ConstructProxy = typename QHashPrivate::HeterogenousConstructProxy<Key, K>;
            Node::createInPlace(n, ConstructProxy(std::forward<K>(key)),
                                std::forward<Args>(args)...);
            ++d->size;
        }
        return {iterator(bucket.toIterator(d)), shouldInsert};
    }